

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tap.c
# Opt level: O2

void print_by_lines(char *message,char *element_name)

{
  char *pcVar1;
  
  if ((message != (char *)0x0) && (*message != '\0')) {
    printf("\t\t\t<%s><![CDATA[");
    while( true ) {
      pcVar1 = pcut_str_find_char(message,'\n');
      if (pcVar1 == (char *)0x0) break;
      *pcVar1 = '\0';
      puts(message);
      message = pcVar1 + 1;
    }
    if (*message != '\0') {
      puts(message);
    }
    printf("]]></%s>\n",element_name);
    return;
  }
  return;
}

Assistant:

static void print_by_lines(const char *message, const char *prefix) {
	char *next_line_start;
	if ((message == NULL) || (message[0] == 0)) {
		return;
	}
	next_line_start = pcut_str_find_char(message, '\n');
	while (next_line_start != NULL) {
		next_line_start[0] = 0;
		printf("%s%s\n", prefix, message);
		message = next_line_start + 1;
		next_line_start = pcut_str_find_char(message, '\n');
	}
	if (message[0] != 0) {
		printf("%s%s\n", prefix, message);
	}
}